

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface_tests.cpp
# Opt level: O0

void __thiscall validationinterface_tests::TestInterface::Call(TestInterface *this)

{
  long lVar1;
  long in_FS_OFFSET;
  BlockValidationState state;
  CBlock block;
  CBlock *in_stack_ffffffffffffff08;
  CBlock *in_stack_ffffffffffffff28;
  BlockValidationState *in_stack_ffffffffffffff58;
  CBlock *in_stack_ffffffffffffff60;
  ValidationSignals *in_stack_ffffffffffffff68;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CBlock::CBlock(in_stack_ffffffffffffff28);
  BlockValidationState::BlockValidationState((BlockValidationState *)in_stack_ffffffffffffff08);
  ValidationSignals::BlockChecked
            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  BlockValidationState::~BlockValidationState((BlockValidationState *)in_stack_ffffffffffffff08);
  CBlock::~CBlock(in_stack_ffffffffffffff08);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Call()
    {
        CBlock block;
        BlockValidationState state;
        m_signals.BlockChecked(block, state);
    }